

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O3

MPP_RET mpp_writer_init(MppWriteCtx *ctx,void *p,RK_S32 size)

{
  ctx->buffer = (RK_U8 *)p;
  ctx->stream = (RK_U8 *)p;
  ctx->size = size;
  ctx->byte_cnt = 0;
  ctx->byte_buffer = 0;
  ctx->buffered_bits = 0;
  ctx->zero_bytes = 0;
  ctx->overflow = 0;
  ctx->emul_cnt = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_writer_init(MppWriteCtx *ctx, void *p, RK_S32 size)
{
    MPP_RET ret;

    ctx->buffer = p;
    ctx->stream = p;
    ctx->size = size;
    ctx->byte_cnt = 0;
    ctx->overflow = 0;
    ctx->byte_buffer = 0;
    ctx->buffered_bits = 0;
    ctx->zero_bytes = 0;
    ctx->emul_cnt = 0;

    ret = mpp_writer_status(ctx);
    if (ret)
        mpp_err_f("failed to init with overflow config\n");

    return ret;
}